

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMultiThreadTests.cpp
# Opt level: O1

bool __thiscall
deqp::egl::MultiThreadedConfigTest::runThread(MultiThreadedConfigTest *this,TestThread *thread)

{
  pointer ppvVar1;
  TestThread *pTVar2;
  uint uVar3;
  int iVar4;
  deUint32 dVar5;
  Library *pLVar6;
  pointer extraout_RAX;
  pointer ppvVar7;
  ThreadLog *pTVar8;
  undefined8 extraout_RAX_00;
  long lVar9;
  int iVar10;
  ulong uVar11;
  EndMessageToken *pEVar12;
  EGLint configCount;
  vector<void_*,_std::allocator<void_*>_> configs;
  EGLint value;
  Random rnd;
  char *local_80;
  vector<void_*,_std::allocator<void_*>_> local_78;
  undefined4 local_54;
  TestThread *local_50;
  int local_48;
  int local_44;
  deRandom local_40;
  
  pLVar6 = EglTestContext::getLibrary((this->super_MultiThreadedTest).super_TestCase.m_eglTestCtx);
  uVar3 = thread->m_id + 0x28c3;
  uVar3 = (uVar3 >> 0x10 ^ uVar3 ^ 0x3d) * 9;
  uVar3 = (uVar3 >> 4 ^ uVar3) * 0x27d4eb2d;
  deRandom_init(&local_40,uVar3 >> 0xf ^ uVar3);
  local_78.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_78.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_78.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_50 = thread;
  MultiThreadedTest::barrier(&this->super_MultiThreadedTest,thread);
  ppvVar7 = extraout_RAX;
  if (0 < this->m_getConfigs) {
    pTVar8 = &local_50->m_log;
    iVar10 = 0;
    do {
      iVar4 = (*pLVar6->_vptr_Library[0x1a])
                        (pLVar6,(this->super_MultiThreadedTest).m_display,0,0,&local_80);
      std::ostream::_M_insert<unsigned_long>((ulong)pTVar8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pTVar8," = eglGetConfigs(",0x11)
      ;
      std::ostream::_M_insert<void_const*>(pTVar8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pTVar8,", NULL, 0, ",0xb);
      std::ostream::operator<<(pTVar8,(int)local_80);
      pEVar12 = (EndMessageToken *)0x383654;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pTVar8,")",1);
      ThreadLog::operator<<(pTVar8,pEVar12);
      dVar5 = (*pLVar6->_vptr_Library[0x1f])(pLVar6);
      eglu::checkError(dVar5,"eglGetConfigs()",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                       ,0x238);
      if (iVar4 == 0) goto LAB_001eb2b4;
      std::vector<void_*,_std::allocator<void_*>_>::resize
                (&local_78,
                 (long)(int)local_80 +
                 ((long)local_78.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_78.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3));
      lVar9 = (long)(int)local_80;
      if (lVar9 != 0) {
        iVar4 = (*pLVar6->_vptr_Library[0x1a])
                          (pLVar6,(this->super_MultiThreadedTest).m_display,
                           local_78.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                           super__Vector_impl_data._M_start +
                           (((ulong)((long)local_78.
                                           super__Vector_base<void_*,_std::allocator<void_*>_>.
                                           _M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_78.
                                          super__Vector_base<void_*,_std::allocator<void_*>_>.
                                          _M_impl.super__Vector_impl_data._M_start) >> 3) - lVar9),
                           lVar9,&local_80);
        std::ostream::_M_insert<unsigned_long>((ulong)pTVar8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pTVar8," = eglGetConfigs(",0x11);
        std::ostream::_M_insert<void_const*>(pTVar8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pTVar8,", &configs\' ",0xc);
        std::ostream::operator<<(pTVar8,(int)local_80);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pTVar8,", ",2);
        std::ostream::operator<<(pTVar8,(int)local_80);
        pEVar12 = (EndMessageToken *)0x383654;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pTVar8,")",1);
        ThreadLog::operator<<(pTVar8,pEVar12);
        dVar5 = (*pLVar6->_vptr_Library[0x1f])(pLVar6);
        eglu::checkError(dVar5,"eglGetConfigs()",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                         ,0x247);
        if (iVar4 == 0) goto LAB_001eb2b4;
      }
      uVar11 = (long)local_78.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_78.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3;
      if (uVar11 < 0x29) {
        dVar5 = deRandom_getUint32(&local_40);
        ppvVar7 = local_78.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_start +
                  (((ulong)((long)local_78.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_78.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 3) -
                  (long)(int)(dVar5 % ((int)uVar11 - 1U)));
      }
      else {
        ppvVar7 = local_78.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_start + 0x28;
      }
      if ((ppvVar7 !=
           local_78.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
           super__Vector_impl_data._M_finish) &&
         (local_78.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppvVar7)) {
        local_78.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data
        ._M_finish = ppvVar7;
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 < this->m_getConfigs);
  }
  if (0 < this->m_chooseConfigs) {
    pTVar8 = &local_50->m_log;
    iVar10 = 0;
    do {
      iVar4 = (*pLVar6->_vptr_Library[2])
                        (pLVar6,(this->super_MultiThreadedTest).m_display,runThread::attribList,0,0,
                         &local_80);
      std::ostream::_M_insert<unsigned_long>((ulong)pTVar8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pTVar8," = eglChooseConfig(",0x13);
      std::ostream::_M_insert<void_const*>(pTVar8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pTVar8,", { EGL_NONE }, NULL, 0, ",0x19);
      std::ostream::operator<<(pTVar8,(int)local_80);
      pEVar12 = (EndMessageToken *)0x383654;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pTVar8,")",1);
      ThreadLog::operator<<(pTVar8,pEVar12);
      dVar5 = (*pLVar6->_vptr_Library[0x1f])(pLVar6);
      eglu::checkError(dVar5,"eglChooseConfig()",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                       ,0x268);
      if (iVar4 == 0) goto LAB_001eb2b4;
      std::vector<void_*,_std::allocator<void_*>_>::resize
                (&local_78,
                 (long)(int)local_80 +
                 ((long)local_78.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_78.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3));
      lVar9 = (long)(int)local_80;
      if (lVar9 != 0) {
        iVar4 = (*pLVar6->_vptr_Library[2])
                          (pLVar6,(this->super_MultiThreadedTest).m_display,runThread::attribList,
                           local_78.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                           super__Vector_impl_data._M_start +
                           (((ulong)((long)local_78.
                                           super__Vector_base<void_*,_std::allocator<void_*>_>.
                                           _M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_78.
                                          super__Vector_base<void_*,_std::allocator<void_*>_>.
                                          _M_impl.super__Vector_impl_data._M_start) >> 3) - lVar9),
                           lVar9,&local_80);
        std::ostream::_M_insert<unsigned_long>((ulong)pTVar8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pTVar8," = eglChooseConfig(",0x13);
        std::ostream::_M_insert<void_const*>(pTVar8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pTVar8,", { EGL_NONE }, &configs, ",0x1a);
        std::ostream::operator<<(pTVar8,(int)local_80);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pTVar8,", ",2);
        std::ostream::operator<<(pTVar8,(int)local_80);
        pEVar12 = (EndMessageToken *)0x383654;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pTVar8,")",1);
        ThreadLog::operator<<(pTVar8,pEVar12);
        dVar5 = (*pLVar6->_vptr_Library[0x1f])(pLVar6);
        eglu::checkError(dVar5,"eglChooseConfig()",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                         ,0x277);
        if (iVar4 == 0) goto LAB_001eb2b4;
      }
      uVar11 = (long)local_78.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_78.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3;
      if (uVar11 < 0x29) {
        dVar5 = deRandom_getUint32(&local_40);
        ppvVar7 = local_78.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_start +
                  (((ulong)((long)local_78.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_78.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 3) -
                  (long)(int)(dVar5 % ((int)uVar11 - 1U)));
      }
      else {
        ppvVar7 = local_78.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_start + 0x28;
      }
      if ((ppvVar7 !=
           local_78.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
           super__Vector_impl_data._M_finish) &&
         (local_78.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppvVar7)) {
        local_78.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data
        ._M_finish = ppvVar7;
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 < this->m_chooseConfigs);
  }
  local_54 = (undefined4)CONCAT71((int7)((ulong)ppvVar7 >> 8),this->m_query < 1);
  if (0 < this->m_query) {
    local_50 = (TestThread *)&local_50->m_log;
    iVar10 = 0;
    do {
      dVar5 = deRandom_getUint32(&local_40);
      ppvVar1 = local_78.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      ppvVar7 = local_78.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar3 = runThread::attributes[dVar5 & 0x1f];
      local_48 = iVar10;
      dVar5 = deRandom_getUint32(&local_40);
      iVar10 = (*pLVar6->_vptr_Library[0x19])
                         (pLVar6,(this->super_MultiThreadedTest).m_display,
                          local_78.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_start
                          [(int)((ulong)dVar5 %
                                ((ulong)((long)ppvVar1 - (long)ppvVar7) >> 3 & 0xffffffff))],
                          (ulong)uVar3,&local_44);
      pTVar2 = local_50;
      std::ostream::_M_insert<unsigned_long>((ulong)local_50);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pTVar2," = eglGetConfigAttrib(",0x16);
      std::ostream::_M_insert<void_const*>(pTVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pTVar2,", ",2);
      std::ostream::_M_insert<void_const*>(pTVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pTVar2,", ",2);
      uVar3 = uVar3 - 0x3020;
      local_80 = "<Unknown>";
      if (uVar3 < 0x23) {
        local_80 = &DAT_0034f0d0 + *(int *)(&DAT_0034f0d0 + (ulong)uVar3 * 4);
      }
      pTVar8 = ThreadLog::operator<<((ThreadLog *)local_50,&local_80);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pTVar8,", ",2);
      std::ostream::operator<<(pTVar8,local_44);
      pEVar12 = (EndMessageToken *)0x383654;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pTVar8,")",1);
      ThreadLog::operator<<(pTVar8,pEVar12);
      dVar5 = (*pLVar6->_vptr_Library[0x1f])(pLVar6);
      eglu::checkError(dVar5,"eglGetConfigAttrib()",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                       ,0x2b9);
      if (iVar10 == 0) break;
      iVar10 = local_48 + 1;
      local_54 = (undefined4)CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),this->m_query <= iVar10);
    } while (iVar10 < this->m_query);
  }
LAB_001eb2bc:
  if (local_78.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return (bool)((byte)local_54 & 1);
LAB_001eb2b4:
  local_54 = 0;
  goto LAB_001eb2bc;
}

Assistant:

bool MultiThreadedConfigTest::runThread (TestThread& thread)
{
	const Library&		egl		= getLibrary();
	de::Random			rnd		(deInt32Hash(thread.getId() + 10435));
	vector<EGLConfig>	configs;

	barrier(thread);

	for (int getConfigsNdx = 0; getConfigsNdx < m_getConfigs; getConfigsNdx++)
	{
		EGLint configCount;

		// Get number of configs
		{
			EGLBoolean result;

			result = egl.getConfigs(m_display, NULL, 0, &configCount);
			thread.getLog() << ThreadLog::BeginMessage << result << " = eglGetConfigs(" << m_display << ", NULL, 0, " << configCount << ")" <<  ThreadLog::EndMessage;
			EGLU_CHECK_MSG(egl, "eglGetConfigs()");

			if (!result)
				return false;
		}

		configs.resize(configs.size() + configCount);

		// Get configs
		if (configCount != 0)
		{
			EGLBoolean result;

			result = egl.getConfigs(m_display, &(configs[configs.size() - configCount]), configCount, &configCount);
			thread.getLog() << ThreadLog::BeginMessage << result << " = eglGetConfigs(" << m_display << ", &configs' " << configCount << ", " << configCount << ")" <<  ThreadLog::EndMessage;
			EGLU_CHECK_MSG(egl, "eglGetConfigs()");

			if (!result)
				return false;
		}

		// Pop configs to stop config list growing
		if (configs.size() > 40)
		{
			configs.erase(configs.begin() + 40, configs.end());
		}
		else
		{
			const int popCount = rnd.getInt(0, (int)(configs.size()-2));

			configs.erase(configs.begin() + (configs.size() - popCount), configs.end());
		}
	}

	for (int chooseConfigsNdx = 0; chooseConfigsNdx < m_chooseConfigs; chooseConfigsNdx++)
	{
		EGLint configCount;

		static const EGLint attribList[] = {
			EGL_NONE
		};

		// Get number of configs
		{
			EGLBoolean result;

			result = egl.chooseConfig(m_display, attribList, NULL, 0, &configCount);
			thread.getLog() << ThreadLog::BeginMessage << result << " = eglChooseConfig(" << m_display << ", { EGL_NONE }, NULL, 0, " << configCount << ")" <<  ThreadLog::EndMessage;
			EGLU_CHECK_MSG(egl, "eglChooseConfig()");

			if (!result)
				return false;
		}

		configs.resize(configs.size() + configCount);

		// Get configs
		if (configCount != 0)
		{
			EGLBoolean result;

			result = egl.chooseConfig(m_display, attribList, &(configs[configs.size() - configCount]), configCount, &configCount);
			thread.getLog() << ThreadLog::BeginMessage << result << " = eglChooseConfig(" << m_display << ", { EGL_NONE }, &configs, " << configCount << ", " << configCount << ")" <<  ThreadLog::EndMessage;
			EGLU_CHECK_MSG(egl, "eglChooseConfig()");

			if (!result)
				return false;
		}

		// Pop configs to stop config list growing
		if (configs.size() > 40)
		{
			configs.erase(configs.begin() + 40, configs.end());
		}
		else
		{
			const int popCount = rnd.getInt(0, (int)(configs.size()-2));

			configs.erase(configs.begin() + (configs.size() - popCount), configs.end());
		}
	}

	{
		// Perform queries on configs
		static const EGLint attributes[] =
		{
			EGL_BUFFER_SIZE,
			EGL_RED_SIZE,
			EGL_GREEN_SIZE,
			EGL_BLUE_SIZE,
			EGL_LUMINANCE_SIZE,
			EGL_ALPHA_SIZE,
			EGL_ALPHA_MASK_SIZE,
			EGL_BIND_TO_TEXTURE_RGB,
			EGL_BIND_TO_TEXTURE_RGBA,
			EGL_COLOR_BUFFER_TYPE,
			EGL_CONFIG_CAVEAT,
			EGL_CONFIG_ID,
			EGL_CONFORMANT,
			EGL_DEPTH_SIZE,
			EGL_LEVEL,
			EGL_MAX_PBUFFER_WIDTH,
			EGL_MAX_PBUFFER_HEIGHT,
			EGL_MAX_PBUFFER_PIXELS,
			EGL_MAX_SWAP_INTERVAL,
			EGL_MIN_SWAP_INTERVAL,
			EGL_NATIVE_RENDERABLE,
			EGL_NATIVE_VISUAL_ID,
			EGL_NATIVE_VISUAL_TYPE,
			EGL_RENDERABLE_TYPE,
			EGL_SAMPLE_BUFFERS,
			EGL_SAMPLES,
			EGL_STENCIL_SIZE,
			EGL_SURFACE_TYPE,
			EGL_TRANSPARENT_TYPE,
			EGL_TRANSPARENT_RED_VALUE,
			EGL_TRANSPARENT_GREEN_VALUE,
			EGL_TRANSPARENT_BLUE_VALUE
		};

		for (int queryNdx = 0; queryNdx < m_query; queryNdx++)
		{
			const EGLint	attribute	= attributes[rnd.getInt(0, DE_LENGTH_OF_ARRAY(attributes)-1)];
			EGLConfig		config		= configs[rnd.getInt(0, (int)(configs.size()-1))];
			EGLint			value;
			EGLBoolean		result;

			result = egl.getConfigAttrib(m_display, config, attribute, &value);
			thread.getLog() << ThreadLog::BeginMessage << result << " = eglGetConfigAttrib(" << m_display << ", " << config << ", " << configAttributeToString(attribute) << ", " << value << ")" <<  ThreadLog::EndMessage;
			EGLU_CHECK_MSG(egl, "eglGetConfigAttrib()");

			if (!result)
				return false;
		}
	}

	return true;
}